

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O2

void QBenchmarkPerfEventsMeasurer::listCounters(void)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  
  bVar2 = isAvailable();
  if (bVar2) {
    puts("The following performance counters are available:");
    for (lVar4 = 4; lVar4 != 0x7e4; lVar4 = lVar4 + 0x18) {
      iVar1 = *(int *)((long)&eventlist[0].offset + lVar4);
      pcVar3 = "hardware";
      if (iVar1 != 0) {
        if (iVar1 == 1) {
          pcVar3 = "software";
        }
        else {
          pcVar3 = "other";
          if (iVar1 == 3) {
            pcVar3 = "cache";
          }
        }
      }
      printf("  %-30s [%s]\n","alignment-faults" + *(uint *)(&UNK_0014c03c + lVar4),pcVar3);
    }
    return;
  }
  puts("Performance counters are not available on this system");
  return;
}

Assistant:

void QBenchmarkPerfEventsMeasurer::listCounters()
{
    if (!isAvailable()) {
        printf("Performance counters are not available on this system\n");
        return;
    }

    printf("The following performance counters are available:\n");
    for (const Events &ev : eventlist) {
        printf("  %-30s [%s]\n", eventlist_strings + ev.offset,
               ev.type == PERF_TYPE_HARDWARE ? "hardware" :
               ev.type == PERF_TYPE_SOFTWARE ? "software" :
               ev.type == PERF_TYPE_HW_CACHE ? "cache" : "other");
    }
}